

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicInputICase1::Run(BasicInputICase1 *this)

{
  long lVar1;
  Vector<unsigned_int,_4> local_1d8;
  Vector<unsigned_int,_4> local_1c8;
  Vector<unsigned_int,_4> local_1b8;
  Vector<unsigned_int,_4> local_1a8;
  Vector<int,_4> local_198;
  Vector<int,_4> local_188;
  Vector<int,_4> local_178;
  Vector<int,_4> local_168;
  Vector<unsigned_int,_4> local_158;
  Vector<unsigned_int,_4> local_148;
  Vector<unsigned_int,_4> local_138;
  Vector<unsigned_int,_4> local_128;
  Vector<int,_4> local_118;
  Vector<int,_4> local_108;
  Vector<int,_4> local_f8;
  Vector<int,_4> local_e8;
  undefined8 local_d8;
  GLuint d_15 [4];
  GLint d_14 [4];
  GLuint d_13 [4];
  GLushort d_12 [4];
  GLubyte d_11 [4];
  GLint d_10 [4];
  GLshort d_9 [4];
  GLbyte d_8 [4];
  GLuint d_7 [4];
  GLint d_6 [4];
  GLuint d_5 [4];
  GLushort d_4 [4];
  GLubyte d_3 [4];
  GLint d_2 [4];
  GLshort d_1 [4];
  GLbyte d [4];
  int kStride;
  GLuint i;
  BasicInputICase1 *this_local;
  
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  for (; (uint)d < 8; d = (GLbyte  [4])((int)d + 1)) {
    glu::CallLogWrapper::glVertexAttribI4i
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,(GLuint)d,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,(int)d + 8,0,0,0,0);
  }
  d_1[2] = 0x58;
  d_1[3] = 0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xb0,(void *)0x0,0x88e4);
  d_1[0] = -0x1ff;
  d_1[1] = -0x3fd;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,4,d_1);
  stack0xffffffffffffffdc = 0xfff80007fffa0005;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,4,8,d_2 + 3);
  stack0xffffffffffffffc8 = 0xfffffff600000009;
  d_2[0] = 0xb;
  d_2[1] = -0xc;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0x10,d_4 + 2);
  d_4[0] = 0xe0d;
  d_4[1] = 0x100f;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x1c,4,d_4);
  stack0xffffffffffffffbc = 0x14001300120011;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x20,8,d_5 + 3);
  d_6[2] = 0x15;
  d_6[3] = 0x16;
  d_5[0] = 0x17;
  d_5[1] = 0x18;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x28,0x10,d_6 + 2);
  d_7[2] = 0x5a;
  d_7[3] = 0xffffffa5;
  d_6[0] = 0x5c;
  d_6[1] = -0x5d;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x38,0x10,d_7 + 2);
  stack0xffffffffffffff88 = 0x5f0000005e;
  d_7[0] = 0x60;
  d_7[1] = 0x61;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x48,0x10,d_9 + 2);
  d_9[0] = -0x19e7;
  d_9[1] = -0x1be5;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x58,4,d_9);
  stack0xffffffffffffff7c = 0xffe0001fffe2001d;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x5c,8,d_10 + 3);
  stack0xffffffffffffff68 = 0xffffffde00000021;
  d_10[0] = 0x23;
  d_10[1] = -0x24;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,100,0x10,d_12 + 2);
  d_12[0] = 0x2625;
  d_12[1] = 0x2827;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x74,4,d_12);
  stack0xffffffffffffff5c = 0x2c002b002a0029;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x78,8,d_13 + 3);
  d_14[2] = 0x2d;
  d_14[3] = 0x2e;
  d_13[0] = 0x2f;
  d_13[1] = 0x30;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x80,0x10,d_14 + 2);
  d_15[2] = 0x62;
  d_15[3] = 0xffffff9d;
  d_14[0] = 100;
  d_14[1] = -0x65;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x90,0x10,d_15 + 2);
  local_d8 = 0x6700000066;
  d_15[0] = 0x68;
  d_15[1] = 0x69;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xa0,0x10,&local_d8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,1,0x1400,0);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,2,0x1402,4);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,3,0x1404,0xc);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,4,0x1404,0x38);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,8,3,0x1401,0x1c);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,9,2,0x1403,0x20);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,10,1,0x1405,0x28);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xb,4,0x1405,0x48);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,8,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,9,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,10,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xb,0);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo,0,0x58);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,8);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,9);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,10);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xb);
  tcu::Vector<int,_4>::Vector(&local_e8,1,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0].m_data = local_e8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0].m_data + 2) =
       local_e8.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_f8,5,-6,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[1].m_data = local_f8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[1].m_data + 2) =
       local_f8.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_108,9,-10,0xb,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[2].m_data = local_108.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[2].m_data + 2) =
       local_108.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_118,0x5a,-0x5b,0x5c,-0x5d);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[3].m_data = local_118.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[3].m_data + 2) =
       local_118.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_128,0xd,0xe,0xf,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[0].m_data = local_128.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[0].m_data + 2) =
       local_128.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_138,0x11,0x12,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[1].m_data = local_138.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[1].m_data + 2) =
       local_138.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_148,0x15,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[2].m_data = local_148.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[2].m_data + 2) =
       local_148.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_158,0x5e,0x5f,0x60,0x61);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[3].m_data = local_158.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[3].m_data + 2) =
       local_158.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_168,0x19,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[8].m_data = local_168.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[8].m_data + 2) =
       local_168.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_178,0x1d,-0x1e,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[9].m_data = local_178.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[9].m_data + 2) =
       local_178.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_188,0x21,-0x22,0x23,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[10].m_data = local_188.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[10].m_data + 2) =
       local_188.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_198,0x62,-99,100,-0x65);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0xb].m_data = local_198.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0xb].m_data + 2) =
       local_198.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_1a8,0x25,0x26,0x27,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[8].m_data = local_1a8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[8].m_data + 2) =
       local_1a8.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_1b8,0x29,0x2a,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[9].m_data = local_1b8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[9].m_data + 2) =
       local_1b8.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_1c8,0x2d,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[10].m_data = local_1c8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[10].m_data + 2) =
       local_1c8.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_1d8,0x66,0x67,0x68,0x69);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[0xb].m_data = local_1d8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[0xb].m_data + 2) =
       local_1d8.m_data._8_8_;
  lVar1 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		const int kStride = 88;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLbyte d[] = { 1, -2, 3, -4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 5, -6, 7, -8 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 9, -10, 11, -12 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 13, 14, 15, 16 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 17, 18, 19, 20 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 21, 22, 23, 24 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 90, -91, 92, -93 };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 94, 95, 96, 97 };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}

		/* */
		{
			GLbyte d[] = { 25, -26, 27, -28 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 29, -30, 31, -32 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 33, -34, 35, -36 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 37, 38, 39, 40 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 41, 42, 43, 44 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 45, 46, 47, 48 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 98, -99, 100, -101 };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 102, 103, 104, 105 };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribIFormat(0, 1, GL_BYTE, 0);
		glVertexAttribIFormat(1, 2, GL_SHORT, 4);
		glVertexAttribIFormat(2, 3, GL_INT, 12);
		glVertexAttribIFormat(3, 4, GL_INT, 56);
		glVertexAttribIFormat(8, 3, GL_UNSIGNED_BYTE, 28);
		glVertexAttribIFormat(9, 2, GL_UNSIGNED_SHORT, 32);
		glVertexAttribIFormat(10, 1, GL_UNSIGNED_INT, 40);
		glVertexAttribIFormat(11, 4, GL_UNSIGNED_INT, 72);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(1, 0);
		glVertexAttribBinding(2, 0);
		glVertexAttribBinding(3, 0);
		glVertexAttribBinding(8, 0);
		glVertexAttribBinding(9, 0);
		glVertexAttribBinding(10, 0);
		glVertexAttribBinding(11, 0);
		glBindVertexBuffer(0, m_vbo, 0, kStride);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(9);
		glEnableVertexAttribArray(10);
		glEnableVertexAttribArray(11);

		expected_datai[0]   = IVec4(1, 0, 0, 1);
		expected_datai[1]   = IVec4(5, -6, 0, 1);
		expected_datai[2]   = IVec4(9, -10, 11, 1);
		expected_datai[3]   = IVec4(90, -91, 92, -93);
		expected_dataui[0]  = UVec4(13, 14, 15, 1);
		expected_dataui[1]  = UVec4(17, 18, 0, 1);
		expected_dataui[2]  = UVec4(21, 0, 0, 1);
		expected_dataui[3]  = UVec4(94, 95, 96, 97);
		expected_datai[8]   = IVec4(25, 0, 0, 1);
		expected_datai[9]   = IVec4(29, -30, 0, 1);
		expected_datai[10]  = IVec4(33, -34, 35, 1);
		expected_datai[11]  = IVec4(98, -99, 100, -101);
		expected_dataui[8]  = UVec4(37, 38, 39, 1);
		expected_dataui[9]  = UVec4(41, 42, 0, 1);
		expected_dataui[10] = UVec4(45, 0, 0, 1);
		expected_dataui[11] = UVec4(102, 103, 104, 105);
		return BasicInputIBase::Run();
	}